

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Database.cpp
# Opt level: O0

TaskSpec * __thiscall
Database::allocate_task
          (Database *this,string *request,string *conn_id,
          vector<std::variant<DatasetLock,_IteratorLock>,_std::allocator<std::variant<DatasetLock,_IteratorLock>_>_>
          *locks)

{
  string_view_t fmt;
  string_view_t fmt_00;
  bool bVar1;
  __visit_result_t<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_CERT_Polska[P]ursadb_libursa_Database_cpp:89:25),_const_std::variant<DatasetLock,_IteratorLock>_&>
  _Var2;
  runtime_error *this_00;
  pointer pTVar3;
  undefined1 uVar4;
  Database *in_RDI;
  pair<std::__detail::_Node_iterator<std::pair<const_unsigned_long,_std::unique_ptr<TaskSpec,_std::default_delete<TaskSpec>_>_>,_false,_false>,_bool>
  pVar5;
  __single_object new_task;
  uint64_t epoch_ms;
  uint64_t task_id;
  variant<DatasetLock,_IteratorLock> *lock;
  const_iterator __end1;
  const_iterator __begin1;
  vector<std::variant<DatasetLock,_IteratorLock>,_std::allocator<std::variant<DatasetLock,_IteratorLock>_>_>
  *__range1;
  variant<DatasetLock,_IteratorLock> *in_stack_fffffffffffffec8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffed0;
  __uniq_ptr_impl<TaskSpec,_std::default_delete<TaskSpec>_> *__args_1;
  DatabaseLock *in_stack_fffffffffffffed8;
  unsigned_long *__args;
  undefined7 in_stack_fffffffffffffee0;
  undefined1 in_stack_fffffffffffffee7;
  unsigned_long local_d0;
  uint64_t local_c8;
  __uniq_ptr_impl<TaskSpec,_std::default_delete<TaskSpec>_> local_c0;
  string local_b8 [16];
  vector<std::variant<DatasetLock,_IteratorLock>,_std::allocator<std::variant<DatasetLock,_IteratorLock>_>_>
  *in_stack_ffffffffffffff58;
  unsigned_long *in_stack_ffffffffffffff60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff70;
  Database *in_stack_ffffffffffffff78;
  string local_70 [48];
  reference local_40;
  variant<DatasetLock,_IteratorLock> *local_38;
  __normal_iterator<const_std::variant<DatasetLock,_IteratorLock>_*,_std::vector<std::variant<DatasetLock,_IteratorLock>,_std::allocator<std::variant<DatasetLock,_IteratorLock>_>_>_>
  local_30 [6];
  
  local_30[0]._M_current =
       (variant<DatasetLock,_IteratorLock> *)
       std::
       vector<std::variant<DatasetLock,_IteratorLock>,_std::allocator<std::variant<DatasetLock,_IteratorLock>_>_>
       ::begin((vector<std::variant<DatasetLock,_IteratorLock>,_std::allocator<std::variant<DatasetLock,_IteratorLock>_>_>
                *)in_stack_fffffffffffffec8);
  local_38 = (variant<DatasetLock,_IteratorLock> *)
             std::
             vector<std::variant<DatasetLock,_IteratorLock>,_std::allocator<std::variant<DatasetLock,_IteratorLock>_>_>
             ::end((vector<std::variant<DatasetLock,_IteratorLock>,_std::allocator<std::variant<DatasetLock,_IteratorLock>_>_>
                    *)in_stack_fffffffffffffec8);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<const_std::variant<DatasetLock,_IteratorLock>_*,_std::vector<std::variant<DatasetLock,_IteratorLock>,_std::allocator<std::variant<DatasetLock,_IteratorLock>_>_>_>
                        *)in_stack_fffffffffffffed0,
                       (__normal_iterator<const_std::variant<DatasetLock,_IteratorLock>_*,_std::vector<std::variant<DatasetLock,_IteratorLock>,_std::allocator<std::variant<DatasetLock,_IteratorLock>_>_>_>
                        *)in_stack_fffffffffffffec8);
    if (!bVar1) {
      local_c0._M_t.super__Tuple_impl<0UL,_TaskSpec_*,_std::default_delete<TaskSpec>_>.
      super__Head_base<0UL,_TaskSpec_*,_false>._M_head_impl =
           (tuple<TaskSpec_*,_std::default_delete<TaskSpec>_>)allocate_task_id(in_RDI);
      local_c8 = get_milli_timestamp();
      __args = &local_d0;
      __args_1 = &local_c0;
      std::
      make_unique<TaskSpec,unsigned_long&,std::__cxx11::string_const&,std::__cxx11::string_const&,unsigned_long&,std::vector<std::variant<DatasetLock,IteratorLock>,std::allocator<std::variant<DatasetLock,IteratorLock>>>const&>
                ((unsigned_long *)in_stack_ffffffffffffff78,in_stack_ffffffffffffff70,
                 in_stack_ffffffffffffff68,in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
      pVar5 = std::
              unordered_map<unsigned_long,std::unique_ptr<TaskSpec,std::default_delete<TaskSpec>>,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long_const,std::unique_ptr<TaskSpec,std::default_delete<TaskSpec>>>>>
              ::emplace<unsigned_long&,std::unique_ptr<TaskSpec,std::default_delete<TaskSpec>>>
                        ((unordered_map<unsigned_long,_std::unique_ptr<TaskSpec,_std::default_delete<TaskSpec>_>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::unique_ptr<TaskSpec,_std::default_delete<TaskSpec>_>_>_>_>
                          *)CONCAT17(in_stack_fffffffffffffee7,in_stack_fffffffffffffee0),__args,
                         (unique_ptr<TaskSpec,_std::default_delete<TaskSpec>_> *)__args_1);
      uVar4 = pVar5.second;
      std::__detail::
      _Node_iterator<std::pair<const_unsigned_long,_std::unique_ptr<TaskSpec,_std::default_delete<TaskSpec>_>_>,_false,_false>
      ::operator->((_Node_iterator<std::pair<const_unsigned_long,_std::unique_ptr<TaskSpec,_std::default_delete<TaskSpec>_>_>,_false,_false>
                    *)0x13f29d);
      pTVar3 = std::unique_ptr<TaskSpec,_std::default_delete<TaskSpec>_>::get
                         ((unique_ptr<TaskSpec,_std::default_delete<TaskSpec>_> *)__args_1);
      std::unique_ptr<TaskSpec,_std::default_delete<TaskSpec>_>::~unique_ptr
                ((unique_ptr<TaskSpec,_std::default_delete<TaskSpec>_> *)
                 CONCAT17(uVar4,in_stack_fffffffffffffee0));
      return pTVar3;
    }
    local_40 = __gnu_cxx::
               __normal_iterator<const_std::variant<DatasetLock,_IteratorLock>_*,_std::vector<std::variant<DatasetLock,_IteratorLock>,_std::allocator<std::variant<DatasetLock,_IteratorLock>_>_>_>
               ::operator*(local_30);
    ::fmt::v6::basic_string_view<char>::basic_string_view
              ((basic_string_view<char> *)in_stack_fffffffffffffed0,
               (char *)in_stack_fffffffffffffec8);
    describe_lock_abi_cxx11_(in_stack_fffffffffffffed8);
    fmt.size_._0_7_ = in_stack_fffffffffffffee0;
    fmt.data_ = (char *)in_stack_fffffffffffffed8;
    fmt.size_._7_1_ = in_stack_fffffffffffffee7;
    spdlog::info<std::__cxx11::string>(fmt,in_stack_fffffffffffffed0);
    std::__cxx11::string::~string(local_70);
    in_stack_ffffffffffffff78 = in_RDI;
    _Var2 = std::
            visit<Database::allocate_task(std::__cxx11::string_const&,std::__cxx11::string_const&,std::vector<std::variant<DatasetLock,IteratorLock>,std::allocator<std::variant<DatasetLock,IteratorLock>>>const&)::__0,std::variant<DatasetLock,IteratorLock>const&>
                      ((anon_class_8_1_8991fb9c *)in_stack_fffffffffffffed0,
                       in_stack_fffffffffffffec8);
    if (((_Var2 ^ 0xffU) & 1) != 0) break;
    __gnu_cxx::
    __normal_iterator<const_std::variant<DatasetLock,_IteratorLock>_*,_std::vector<std::variant<DatasetLock,_IteratorLock>,_std::allocator<std::variant<DatasetLock,_IteratorLock>_>_>_>
    ::operator++(local_30);
  }
  ::fmt::v6::basic_string_view<char>::basic_string_view
            ((basic_string_view<char> *)in_stack_fffffffffffffed0,(char *)in_stack_fffffffffffffec8)
  ;
  describe_lock_abi_cxx11_(in_stack_fffffffffffffed8);
  fmt_00.size_._0_7_ = in_stack_fffffffffffffee0;
  fmt_00.data_ = (char *)in_stack_fffffffffffffed8;
  fmt_00.size_._7_1_ = in_stack_fffffffffffffee7;
  spdlog::warn<std::__cxx11::string>(fmt_00,in_stack_fffffffffffffed0);
  std::__cxx11::string::~string(local_b8);
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(this_00,"Can\'t acquire lock");
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

TaskSpec *Database::allocate_task(const std::string &request,
                                  const std::string &conn_id,
                                  const std::vector<DatabaseLock> &locks) {
    for (const auto &lock : locks) {
        spdlog::info("LOCK: {}", describe_lock(lock));
        if (!std::visit([this](auto &l) { return can_acquire(l); }, lock)) {
            spdlog::warn("Can't lock {}!", describe_lock(lock));
            throw std::runtime_error("Can't acquire lock");
        }
    }
    uint64_t task_id = allocate_task_id();
    uint64_t epoch_ms = get_milli_timestamp();
    auto new_task{
        std::make_unique<TaskSpec>(task_id, conn_id, request, epoch_ms, locks)};
    return tasks.emplace(task_id, std::move(new_task)).first->second.get();
}